

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AddDefinition(cmMakefile *this,string *name,char *value)

{
  char *pcVar1;
  char *name_00;
  bool bVar2;
  Internals *this_00;
  cmVariableWatch *this_01;
  cmVariableWatch *vv;
  allocator local_41;
  string local_40;
  char *local_20;
  char *value_local;
  string *name_local;
  cmMakefile *this_local;
  
  if (value != (char *)0x0) {
    local_20 = value;
    value_local = (char *)name;
    name_local = (string *)this;
    bVar2 = VariableInitialized(this,name);
    if (bVar2) {
      LogUnused(this,"changing definition",(string *)value_local);
    }
    this_00 = cmsys::auto_ptr<cmMakefile::Internals>::operator->(&this->Internal);
    name_00 = value_local;
    pcVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
    Internals::SetDefinition(this_00,(string *)name_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_01 = GetVariableWatch(this);
    if (this_01 != (cmVariableWatch *)0x0) {
      cmVariableWatch::VariableAccessed(this_01,(string *)value_local,3,local_20,this);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddDefinition(const std::string& name, const char* value)
{
  if (!value )
    {
    return;
    }

  if (this->VariableInitialized(name))
    {
    this->LogUnused("changing definition", name);
    }
  this->Internal->SetDefinition(name, value);

#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if ( vv )
    {
    vv->VariableAccessed(name,
                         cmVariableWatch::VARIABLE_MODIFIED_ACCESS,
                         value,
                         this);
    }
#endif
}